

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

size_t aead_do_encrypt_final(ptls_aead_context_t *_ctx,void *_output)

{
  int iVar1;
  int local_3c;
  int ret;
  int blocklen;
  size_t tag_size;
  size_t off;
  uint8_t *output;
  aead_crypto_context_t *ctx;
  void *_output_local;
  ptls_aead_context_t *_ctx_local;
  
  tag_size = 0;
  _ret = _ctx->algo->tag_size;
  off = (size_t)_output;
  output = (uint8_t *)_ctx;
  ctx = (aead_crypto_context_t *)_output;
  _output_local = _ctx;
  iVar1 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)_output,&local_3c);
  if (iVar1 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c"
                  ,0x3a2,"size_t aead_do_encrypt_final(ptls_aead_context_t *, void *)");
  }
  tag_size = (long)local_3c + tag_size;
  iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)(output + 0x40),0x10,(int)_ret,
                              (void *)(off + tag_size));
  if (iVar1 != 0) {
    return _ret + tag_size;
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c",
                0x3a5,"size_t aead_do_encrypt_final(ptls_aead_context_t *, void *)");
}

Assistant:

static size_t aead_do_encrypt_final(ptls_aead_context_t *_ctx, void *_output)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output;
    size_t off = 0, tag_size = ctx->super.algo->tag_size;
    int blocklen, ret;

    ret = EVP_EncryptFinal_ex(ctx->evp_ctx, output + off, &blocklen);
    assert(ret);
    off += blocklen;
    ret = EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_GET_TAG, (int)tag_size, output + off);
    assert(ret);
    off += tag_size;

    return off;
}